

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexParens_Test::TestBody(LexerTest_LexParens_Test *this)

{
  char **this_00;
  char **this_01;
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  bool bVar2;
  string_view buffer;
  undefined1 local_308 [8];
  Token left;
  Token right;
  Lexer lexer;
  Lexer it;
  Token t1;
  Token t2;
  Token t3;
  Token t4;
  AssertHelper local_c0;
  undefined1 auStack_b8 [8];
  AssertionResult gtest_ar_5;
  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  _Stack_90;
  ulong uStack_60;
  AssertHelper local_50;
  AssertionResult gtest_ar_4;
  
  local_308 = (undefined1  [8])0x1;
  left.span._M_len = (long)"Expected: (" + 10;
  left.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._M_u._32_1_ = 0;
  left.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._M_index = '\x01';
  left.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._41_7_ = 0;
  right.span._M_len = (long)"*lexer->getF32()" + 0xf;
  right.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._M_u._32_1_ = 1;
  buffer._M_str = "(())";
  buffer._M_len = 4;
  wasm::WATParser::Lexer::Lexer
            ((Lexer *)((long)&right.data.
                              super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              .
                              super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                      + 0x28),buffer);
  it.buffer._M_str = lexer.buffer._M_str;
  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._M_engaged =
       (bool)right.data.
             super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
             .
             super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
             .
             super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
             .
             super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
             .
             super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
             .
             super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
             ._M_index;
  lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._65_7_ =
       right.data.
       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       .
       super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
       ._41_7_;
  it.buffer._M_len = lexer.buffer._M_len;
  it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._M_index = '\0';
  bVar2 = lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
          super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
          super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._M_index == '\x01';
  if (bVar2) {
    it.index = lexer.index;
    it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.span._M_len =
         lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
         super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.span._M_len;
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)((long)&it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                 .super__Optional_payload_base<wasm::WATParser::Token>._M_payload +
                         8),(_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             *)((long)&lexer.curr.
                                       super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                       _M_payload.
                                       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                       .super__Optional_payload_base<wasm::WATParser::Token>.
                                       _M_payload + 8));
  }
  _Stack_90._40_8_ = 0;
  uStack_60 = 0;
  _Stack_90._M_u._24_8_ = 0;
  _Stack_90._M_u._32_8_ = 0;
  _Stack_90._M_u._8_8_ = 0;
  _Stack_90._M_u._16_8_ = 0;
  _Stack_90._M_u._0_8_ = 0;
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  auStack_b8 = (undefined1  [8])0x0;
  gtest_ar_5.success_ = false;
  gtest_ar_5._1_7_ = 0;
  it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
  super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
  super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
  super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  .
  super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ._M_index = bVar2;
  testing::internal::CmpHelperNE<wasm::WATParser::Lexer,wasm::WATParser::Lexer>
            ((internal *)
             &it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
              super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
              super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,"it","lexer.end()",
             (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                       _M_payload.
                       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                       super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
             (Lexer *)auStack_b8);
  if (uStack_60._0_1_ == true) {
    uStack_60 = uStack_60 & 0xffffffffffffff00;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage(&_Stack_90);
  }
  if (it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_engaged == false) {
    testing::Message::Message((Message *)auStack_b8);
    if (t1.span._M_len == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)t1.span._M_len;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               ((long)&t1.data.
                       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
               + 0x28),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               ((long)&t1.data.
                       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
               + 0x28),(Message *)auStack_b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               ((long)&t1.data.
                       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
               + 0x28));
    if (auStack_b8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)auStack_b8 + 8))();
    }
    if (t1.span._M_len != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&t1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          t1.span._M_len);
    }
  }
  else {
    if (t1.span._M_len != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&t1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          t1.span._M_len);
    }
    wasm::WATParser::Lexer::operator++
              ((Lexer *)auStack_b8,
               (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                         super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,0);
    this_00 = &t1.span._M_str;
    it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._M_engaged = false;
    it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._65_7_ = 0;
    t1.span._M_len = 0;
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)this_00,
                      (_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)&_Stack_90);
    if (uStack_60._0_1_ == true) {
      uStack_60 = uStack_60 & 0xffffffffffffff00;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::~_Variant_storage(&_Stack_90);
    }
    _Stack_90._40_8_ = 0;
    uStack_60 = 0;
    _Stack_90._M_u._24_8_ = 0;
    _Stack_90._M_u._32_8_ = 0;
    _Stack_90._M_u._8_8_ = 0;
    _Stack_90._M_u._16_8_ = 0;
    _Stack_90._M_u._0_8_ = 0;
    gtest_ar_5.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    auStack_b8 = (undefined1  [8])0x0;
    gtest_ar_5.success_ = false;
    gtest_ar_5._1_7_ = 0;
    testing::internal::CmpHelperNE<wasm::WATParser::Lexer,wasm::WATParser::Lexer>
              ((internal *)
               ((long)&t1.data.
                       super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
               + 0x28),"it","lexer.end()",
               (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                         _M_payload.
                         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                         super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
               (Lexer *)auStack_b8);
    if (uStack_60._0_1_ == true) {
      uStack_60 = uStack_60 & 0xffffffffffffff00;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::~_Variant_storage(&_Stack_90);
    }
    if (t1.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._M_index == '\0') {
      testing::Message::Message((Message *)auStack_b8);
      if (t2.span._M_len == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)t2.span._M_len;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 ((long)&t2.data.
                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                 + 0x28),kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                 ,0x6b,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 ((long)&t2.data.
                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                 + 0x28),(Message *)auStack_b8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 ((long)&t2.data.
                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                 + 0x28));
      if (auStack_b8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)auStack_b8 + 8))();
      }
      if (t2.span._M_len != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&t2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            t2.span._M_len);
      }
    }
    else {
      if (t2.span._M_len != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&t2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            t2.span._M_len);
      }
      wasm::WATParser::Lexer::operator++
                ((Lexer *)auStack_b8,
                 (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                           super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,0);
      this_01 = &t2.span._M_str;
      t1.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._M_index = '\0';
      t1.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._41_7_ = 0;
      t2.span._M_len = 0;
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)this_01,
                        (_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)&_Stack_90);
      if (uStack_60._0_1_ == true) {
        uStack_60 = uStack_60 & 0xffffffffffffff00;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ::~_Variant_storage(&_Stack_90);
      }
      _Stack_90._40_8_ = 0;
      uStack_60 = 0;
      _Stack_90._M_u._24_8_ = 0;
      _Stack_90._M_u._32_8_ = 0;
      _Stack_90._M_u._8_8_ = 0;
      _Stack_90._M_u._16_8_ = 0;
      _Stack_90._M_u._0_8_ = 0;
      gtest_ar_5.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      auStack_b8 = (undefined1  [8])0x0;
      gtest_ar_5.success_ = false;
      gtest_ar_5._1_7_ = 0;
      testing::internal::CmpHelperNE<wasm::WATParser::Lexer,wasm::WATParser::Lexer>
                ((internal *)
                 ((long)&t2.data.
                         super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                 + 0x28),"it","lexer.end()",
                 (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                           _M_payload.
                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                           super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                 (Lexer *)auStack_b8);
      if (uStack_60._0_1_ == true) {
        uStack_60 = uStack_60 & 0xffffffffffffff00;
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ::~_Variant_storage(&_Stack_90);
      }
      if (t2.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._M_index == '\0') {
        testing::Message::Message((Message *)auStack_b8);
        if (t3.span._M_len == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)t3.span._M_len;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   ((long)&t3.data.
                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                   + 0x28),kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                   ,0x6d,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   ((long)&t3.data.
                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                   + 0x28),(Message *)auStack_b8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   ((long)&t3.data.
                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                   + 0x28));
        if (auStack_b8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)auStack_b8 + 8))();
        }
        if (t3.span._M_len != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&t3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              t3.span._M_len);
        }
      }
      else {
        if (t3.span._M_len != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&t3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              t3.span._M_len);
        }
        wasm::WATParser::Lexer::operator++
                  ((Lexer *)auStack_b8,
                   (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                             _M_payload.
                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                             super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,0);
        t2.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._M_index = '\0';
        t2.data.
        super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        .
        super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ._41_7_ = 0;
        t3.span._M_len = 0;
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           *)&t3.span._M_str,
                          (_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           *)&_Stack_90);
        if (uStack_60._0_1_ == true) {
          uStack_60 = uStack_60 & 0xffffffffffffff00;
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ::~_Variant_storage(&_Stack_90);
        }
        _Stack_90._40_8_ = 0;
        uStack_60 = 0;
        _Stack_90._M_u._24_8_ = 0;
        _Stack_90._M_u._32_8_ = 0;
        _Stack_90._M_u._8_8_ = 0;
        _Stack_90._M_u._16_8_ = 0;
        _Stack_90._M_u._0_8_ = 0;
        gtest_ar_5.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        auStack_b8 = (undefined1  [8])0x0;
        gtest_ar_5.success_ = false;
        gtest_ar_5._1_7_ = 0;
        testing::internal::CmpHelperNE<wasm::WATParser::Lexer,wasm::WATParser::Lexer>
                  ((internal *)
                   ((long)&t3.data.
                           super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                   + 0x28),"it","lexer.end()",
                   (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                             _M_payload.
                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                             super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                   (Lexer *)auStack_b8);
        if (uStack_60._0_1_ == true) {
          uStack_60 = uStack_60 & 0xffffffffffffff00;
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ::~_Variant_storage(&_Stack_90);
        }
        if (t3.data.
            super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            .
            super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ._M_index == '\0') {
          testing::Message::Message((Message *)auStack_b8);
          if (t4.span._M_len == 0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = *(char **)t4.span._M_len;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                     ,0x6f,pcVar1);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)auStack_b8);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if (auStack_b8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)auStack_b8 + 8))();
          }
          if (t4.span._M_len != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&t4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )t4.span._M_len);
          }
        }
        else {
          if (t4.span._M_len != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&t4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )t4.span._M_len);
          }
          wasm::WATParser::Lexer::operator++
                    ((Lexer *)auStack_b8,
                     (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>
                               ._M_payload.
                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                               super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,0);
          t3.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._M_index = '\0';
          t3.data.
          super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          .
          super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ._41_7_ = 0;
          t4.span._M_len = 0;
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             *)&t4.span._M_str,
                            (_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             *)&_Stack_90);
          if (uStack_60._0_1_ == true) {
            uStack_60 = uStack_60 & 0xffffffffffffff00;
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ::~_Variant_storage(&_Stack_90);
          }
          _Stack_90._40_8_ = 0;
          uStack_60 = 0;
          _Stack_90._M_u._24_8_ = 0;
          _Stack_90._M_u._32_8_ = 0;
          _Stack_90._M_u._8_8_ = 0;
          _Stack_90._M_u._16_8_ = 0;
          _Stack_90._M_u._0_8_ = 0;
          gtest_ar_5.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          auStack_b8 = (undefined1  [8])0x0;
          gtest_ar_5.success_ = false;
          gtest_ar_5._1_7_ = 0;
          testing::internal::CmpHelperEQ<wasm::WATParser::Lexer,wasm::WATParser::Lexer>
                    ((internal *)&local_50,"it","lexer.end()",
                     (Lexer *)&lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>
                               ._M_payload.
                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                               super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                     (Lexer *)auStack_b8);
          if (uStack_60._0_1_ == true) {
            uStack_60 = uStack_60 & 0xffffffffffffff00;
            std::__detail::__variant::
            _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
            ::~_Variant_storage(&_Stack_90);
          }
          if (local_50.data_._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)auStack_b8);
            if (gtest_ar_4._0_8_ == 0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = *(char **)gtest_ar_4._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x71,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,(Message *)auStack_b8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            if (auStack_b8 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)auStack_b8 + 8))();
            }
          }
          if (gtest_ar_4._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_4,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_4._0_8_);
          }
          testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                    ((internal *)auStack_b8,"t1","left",
                     (Token *)&it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>.
                               _M_payload.
                               super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                               super__Optional_payload_base<wasm::WATParser::Token>._M_engaged,
                     (Token *)local_308);
          if (auStack_b8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_50);
            if (gtest_ar_5._0_8_ == 0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = *(char **)gtest_ar_5._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x73,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            if ((long *)CONCAT71(local_50.data_._1_7_,local_50.data_._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_50.data_._1_7_,local_50.data_._0_1_) + 8))();
            }
          }
          if (gtest_ar_5._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_5,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_5._0_8_);
          }
          testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                    ((internal *)auStack_b8,"t2","left",
                     (Token *)((long)&t1.data.
                                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              + 0x28),(Token *)local_308);
          if (auStack_b8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_50);
            if (gtest_ar_5._0_8_ == 0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = *(char **)gtest_ar_5._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x74,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            if ((long *)CONCAT71(local_50.data_._1_7_,local_50.data_._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_50.data_._1_7_,local_50.data_._0_1_) + 8))();
            }
          }
          if (gtest_ar_5._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_5,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_5._0_8_);
          }
          testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                    ((internal *)auStack_b8,"t3","right",
                     (Token *)((long)&t2.data.
                                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              + 0x28),
                     (Token *)((long)&left.data.
                                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              + 0x28));
          if (auStack_b8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_50);
            if (gtest_ar_5._0_8_ == 0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = *(char **)gtest_ar_5._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x75,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            if ((long *)CONCAT71(local_50.data_._1_7_,local_50.data_._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_50.data_._1_7_,local_50.data_._0_1_) + 8))();
            }
          }
          if (gtest_ar_5._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_5,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_5._0_8_);
          }
          testing::internal::CmpHelperEQ<wasm::WATParser::Token,wasm::WATParser::Token>
                    ((internal *)auStack_b8,"t4","right",
                     (Token *)((long)&t3.data.
                                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              + 0x28),
                     (Token *)((long)&left.data.
                                      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                                      .
                                      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                              + 0x28));
          if (auStack_b8[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_50);
            if (gtest_ar_5._0_8_ == 0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = *(char **)gtest_ar_5._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x76,pcVar1);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            if ((long *)CONCAT71(local_50.data_._1_7_,local_50.data_._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_50.data_._1_7_,local_50.data_._0_1_) + 8))();
            }
          }
          if (gtest_ar_5._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_5,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_5._0_8_);
          }
          local_50.data_._0_1_ =
               (internal)
               (left.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._M_u._32_1_ == '\0');
          gtest_ar_4.success_ = false;
          gtest_ar_4._1_7_ = 0;
          if (!(bool)local_50.data_._0_1_) {
            testing::Message::Message((Message *)&gtest_ar_4.message_);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)auStack_b8,(internal *)&local_50,
                       (AssertionResult *)"left.isLParen()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x77,(char *)auStack_b8);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_ar_4.message_);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (auStack_b8 != (undefined1  [8])&gtest_ar_5.message_) {
              operator_delete((void *)auStack_b8,
                              (long)gtest_ar_5.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 1);
            }
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_4.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(long *)gtest_ar_4.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 8))();
            }
          }
          if (gtest_ar_4._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_4,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_4._0_8_);
          }
          local_50.data_._0_1_ =
               (internal)
               (right.data.
                super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                .
                super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                ._M_u._32_1_ == '\x01');
          gtest_ar_4.success_ = false;
          gtest_ar_4._1_7_ = 0;
          if (!(bool)local_50.data_._0_1_) {
            testing::Message::Message((Message *)&gtest_ar_4.message_);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)auStack_b8,(internal *)&local_50,
                       (AssertionResult *)"right.isRParen()","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_c0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/wat-lexer.cpp"
                       ,0x78,(char *)auStack_b8);
            testing::internal::AssertHelper::operator=(&local_c0,(Message *)&gtest_ar_4.message_);
            testing::internal::AssertHelper::~AssertHelper(&local_c0);
            if (auStack_b8 != (undefined1  [8])&gtest_ar_5.message_) {
              operator_delete((void *)auStack_b8,
                              (long)gtest_ar_5.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 1);
            }
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar_4.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(long *)gtest_ar_4.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 8))();
            }
          }
          if (gtest_ar_4._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_4,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_4._0_8_);
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
          ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                               *)&t4.span._M_str);
        }
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                             *)&t3.span._M_str);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                           *)this_01);
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)this_00);
  }
  if (it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._M_index == '\x01') {
    it.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._M_index = '\0';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)((long)&it.curr.
                                   super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                   _M_payload.
                                   super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                   .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                           + 8));
  }
  if (lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
      super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
      super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
      super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      .
      super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ._M_index == '\x01') {
    lexer.curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
    super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
    super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.data.
    super__Variant_base<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_assign_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Move_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Copy_ctor_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    .
    super__Variant_storage_alias<wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ._M_index = '\0';
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)((long)&lexer.curr.
                                   super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                   _M_payload.
                                   super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                   .super__Optional_payload_base<wasm::WATParser::Token>._M_payload
                           + 8));
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)&right.span._M_str);
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)&left.span._M_str);
  return;
}

Assistant:

TEST(LexerTest, LexParens) {
  Token left{"("sv, LParenTok{}};
  Token right{")"sv, RParenTok{}};

  Lexer lexer("(())"sv);

  auto it = lexer.begin();
  ASSERT_NE(it, lexer.end());
  Token t1 = *it++;
  ASSERT_NE(it, lexer.end());
  Token t2 = *it++;
  ASSERT_NE(it, lexer.end());
  Token t3 = *it++;
  ASSERT_NE(it, lexer.end());
  Token t4 = *it++;
  EXPECT_EQ(it, lexer.end());

  EXPECT_EQ(t1, left);
  EXPECT_EQ(t2, left);
  EXPECT_EQ(t3, right);
  EXPECT_EQ(t4, right);
  EXPECT_TRUE(left.isLParen());
  EXPECT_TRUE(right.isRParen());
}